

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-mongo.c
# Opt level: O2

int op_kill(lua_State *L)

{
  int iVar1;
  int iVar2;
  char *buf_00;
  int sz;
  long lVar3;
  size_t cursor_len;
  buffer buf;
  
  cursor_len = 0;
  iVar2 = 1;
  buf_00 = luaL_tolstring(L,1,&cursor_len);
  if (cursor_len == 8) {
    buf.ptr = buf.buffer;
    buf.size = 0;
    buf.cap = 0x80;
    iVar1 = reserve_length(&buf);
    write_int32(&buf,0);
    write_int32(&buf,0);
    write_int32(&buf,0x7d7);
    write_int32(&buf,0);
    write_int32(&buf,1);
    write_bytes(&buf,buf_00,sz);
    lVar3 = (long)iVar1;
    buf.ptr[lVar3] = (uint8_t)buf.size;
    buf.ptr[lVar3 + 1] = buf.size._1_1_;
    buf.ptr[lVar3 + 2] = buf.size._2_1_;
    buf.ptr[lVar3 + 3] = buf.size._3_1_;
    lua_pushlstring(L,(char *)buf.ptr,(long)buf.size);
    buffer_destroy(&buf);
  }
  else {
    iVar2 = luaL_error(L,"Invalid cursor id");
  }
  return iVar2;
}

Assistant:

static int
op_kill(lua_State *L) {
	size_t cursor_len = 0;
	const char * cursor_id = luaL_tolstring(L, 1, &cursor_len);
	if (cursor_len != 8) {
		return luaL_error(L, "Invalid cursor id");
	}

	struct buffer buf;
	buffer_create(&buf);

	int len = reserve_length(&buf);
	write_int32(&buf, 0);
	write_int32(&buf, 0);
	write_int32(&buf, OP_KILL_CURSORS);

	write_int32(&buf, 0);
	write_int32(&buf, 1);
	write_bytes(&buf, cursor_id, 8);

	write_length(&buf, buf.size, len);

	lua_pushlstring(L, (const char *)buf.ptr, buf.size);
	buffer_destroy(&buf);

	return 1;
}